

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

opj_cond_t * opj_cond_create(void)

{
  int iVar1;
  pthread_cond_t *__cond;
  
  __cond = (pthread_cond_t *)opj_malloc(0x30);
  if (__cond != (pthread_cond_t *)0x0) {
    iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar1 == 0) {
      return (opj_cond_t *)__cond;
    }
    opj_free(__cond);
  }
  return (opj_cond_t *)0x0;
}

Assistant:

opj_cond_t* opj_cond_create(void)
{
    opj_cond_t* cond = (opj_cond_t*) opj_malloc(sizeof(opj_cond_t));
    if (!cond) {
        return NULL;
    }
    if (pthread_cond_init(&(cond->cond), NULL) != 0) {
        opj_free(cond);
        return NULL;
    }
    return cond;
}